

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O3

DatabaseName * DatabaseName::parse(DatabaseName *__return_storage_ptr__,path *db_base,string *name)

{
  pointer pcVar1;
  long lVar2;
  runtime_error *this;
  string id;
  string type;
  string local_110;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  path local_70;
  
  std::__cxx11::string::find((char)name,0x2e);
  lVar2 = std::__cxx11::string::find((char)name,0x2e);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)name);
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)name);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_70,db_base);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_90,local_88 + (long)local_90);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_b0,local_a8 + (long)local_b0);
    pcVar1 = (name->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + name->_M_string_length);
    DatabaseName(__return_storage_ptr__,&local_70,&local_d0,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid dataset ID found");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DatabaseName DatabaseName::parse(fs::path db_base, const std::string &name) {
    auto first_dot = name.find('.');
    auto second_dot = name.find('.', first_dot + 1);
    if (second_dot == std::string::npos) {
        throw std::runtime_error("Invalid dataset ID found");
    }
    std::string type = name.substr(0, first_dot);
    std::string id = name.substr(first_dot + 1, second_dot - first_dot - 1);
    return DatabaseName(std::move(db_base), type, id, name);
}